

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memplumber.cpp
# Opt level: O2

void __thiscall MemPlumberInternal::MemPlumberInternal(MemPlumberInternal *this)

{
  long lVar1;
  
  this->m_Started = false;
  this->m_Verbose = false;
  for (lVar1 = -0x20000; lVar1 != 0; lVar1 = lVar1 + 8) {
    *(undefined8 *)((long)this->m_StaticPointerListHashtable + lVar1) = 0;
    *(undefined8 *)(&this->m_Started + lVar1) = 0;
  }
  this->m_ProgramStarted = -1;
  return;
}

Assistant:

MemPlumberInternal() {
        m_Started = false;
        m_Verbose = false;

        // zero the hashtables
        for (int i = 0; i < MEMPLUMBER_HASHTABLE_SIZE; i++) {
            m_PointerListHashtable[i] = NULL;
            m_StaticPointerListHashtable[i] = NULL;
        }

        #ifdef COLLECT_STATIC_VAR_DATA
        m_ProgramStarted = 0;
        #else
        m_ProgramStarted = -1;
        #endif //COLLECT_STATIC_VAR_DATA
    }